

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Get(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Aig_Man_t *p;
  Gia_Man_t *p_00;
  Vec_Ptr_t *pVVar5;
  float *pfVar6;
  Vec_Flt_t *pVVar7;
  char *pcVar8;
  float fVar9;
  Abc_Ntk_t *pNtk;
  int fVerbose;
  int fNames;
  int fMapped;
  int fGiaSimple;
  int c;
  char *pInits;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pStrash;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fNames = 0;
  bVar1 = false;
  bVar2 = false;
  pNtk._4_4_ = 0;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"cmnvh"), iVar3 != -1) {
    switch(iVar3) {
    case 99:
      fNames = fNames ^ 1;
      break;
    default:
      Abc_Print(-2,"usage: &get [-cmnvh] <file>\n");
      Abc_Print(-2,"\t         converts the current network into GIA and moves it to the &-space\n")
      ;
      Abc_Print(-2,
                "\t         (if the network is a sequential logic network, normalizes the flops\n");
      Abc_Print(-2,"\t         to have const-0 initial values, equivalent to \"undc; st; zero\")\n")
      ;
      pcVar8 = "no";
      if (fNames != 0) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggles allowing simple GIA to be imported [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (bVar1) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggles preserving the current mapping [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (bVar2) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggles saving CI/CO names of the AIG [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (pNtk._4_4_ != 0) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : the file name\n");
      return 1;
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x6e:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x76:
      pNtk._4_4_ = pNtk._4_4_ ^ 1;
    }
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"There is no current network\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar3 = Abc_NtkIsStrash(pAbc->pNtkCur);
    if (iVar3 == 0) {
      if ((fNames != 0) || (bVar1)) {
        iVar3 = Abc_NtkIsLogic(pAbc->pNtkCur);
        if (iVar3 == 0) {
          __assert_fail("Abc_NtkIsLogic(pAbc->pNtkCur)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                        ,0x765a,"int Abc_CommandAbc9Get(Abc_Frame_t *, int, char **)");
        }
        Abc_NtkToAig(pAbc->pNtkCur);
        pTemp = Abc_NtkAigToGia(pAbc->pNtkCur,fNames);
      }
      else {
        pAVar4 = Abc_NtkStrash(pAbc->pNtkCur,0,1,0);
        p = Abc_NtkToDar(pAVar4,0,0);
        Abc_NtkDelete(pAVar4);
        p_00 = Gia_ManFromAig(p);
        Aig_ManStop(p);
        pcVar8 = Abc_NtkCollectLatchValuesStr(pAbc->pNtkCur);
        pTemp = Gia_ManDupZeroUndc(p_00,pcVar8,0,0,pNtk._4_4_);
        Gia_ManStop(p_00);
        if (pcVar8 != (char *)0x0) {
          free(pcVar8);
        }
      }
    }
    else {
      iVar3 = Abc_NtkGetChoiceNum(pAbc->pNtkCur);
      if (iVar3 == 0) {
        pGia = (Gia_Man_t *)Abc_NtkToDar(pAbc->pNtkCur,0,1);
      }
      else {
        pGia = (Gia_Man_t *)Abc_NtkToDarChoices(pAbc->pNtkCur);
      }
      pTemp = Gia_ManFromAig((Aig_Man_t *)pGia);
      Aig_ManStop((Aig_Man_t *)pGia);
    }
    if (bVar2) {
      pVVar5 = Abc_NtkCollectCiNames(pAbc->pNtkCur);
      pTemp->vNamesIn = pVVar5;
      pVVar5 = Abc_NtkCollectCoNames(pAbc->pNtkCur);
      pTemp->vNamesOut = pVVar5;
    }
    if (pAbc->pNtkCur->pManTime != (Abc_ManTime_t *)0x0) {
      pAVar4 = pAbc->pNtkCur;
      Vec_FltFreeP(&pTemp->vInArrs);
      Vec_FltFreeP(&pTemp->vOutReqs);
      fVar9 = Abc_NtkReadDefaultArrivalWorst(pAVar4);
      pTemp->DefInArrs = fVar9;
      fVar9 = Abc_NtkReadDefaultRequiredWorst(pAVar4);
      pTemp->DefOutReqs = fVar9;
      pfVar6 = Abc_NtkGetCiArrivalFloats(pAVar4);
      iVar3 = Abc_NtkCiNum(pAVar4);
      pVVar7 = Vec_FltAllocArray(pfVar6,iVar3);
      pTemp->vInArrs = pVVar7;
      pfVar6 = Abc_NtkGetCoRequiredFloats(pAVar4);
      iVar3 = Abc_NtkCoNum(pAVar4);
      pVVar7 = Vec_FltAllocArray(pfVar6,iVar3);
      pTemp->vOutReqs = pVVar7;
      pTemp->And2Delay = (int)pAVar4->AndGateDelay;
    }
    Abc_FrameUpdateGia(pAbc,pTemp);
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9Get( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Aig_Man_t * Abc_NtkToDarChoices( Abc_Ntk_t * pNtk );
    extern Vec_Ptr_t * Abc_NtkCollectCiNames( Abc_Ntk_t * pNtk );
    extern Vec_Ptr_t * Abc_NtkCollectCoNames( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pStrash;
    Aig_Man_t * pAig;
    Gia_Man_t * pGia, * pTemp;
    char * pInits;
    int c, fGiaSimple = 0, fMapped = 0, fNames = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cmnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 'm':
            fMapped ^= 1;
            break;
        case 'n':
            fNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( -1, "There is no current network\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash( pAbc->pNtkCur ) )
    {
        if ( fGiaSimple || fMapped )
        {
            assert( Abc_NtkIsLogic(pAbc->pNtkCur) );
            Abc_NtkToAig( pAbc->pNtkCur );
            pGia = Abc_NtkAigToGia( pAbc->pNtkCur, fGiaSimple );
        }
        else
        {
            // derive comb GIA
            pStrash = Abc_NtkStrash( pAbc->pNtkCur, 0, 1, 0 );
            pAig = Abc_NtkToDar( pStrash, 0, 0 );
            Abc_NtkDelete( pStrash );
            pGia = Gia_ManFromAig( pAig );
            Aig_ManStop( pAig );
            // perform undc/zero
            pInits = Abc_NtkCollectLatchValuesStr( pAbc->pNtkCur );
            pGia = Gia_ManDupZeroUndc( pTemp = pGia, pInits, 0, 0, fVerbose );
            Gia_ManStop( pTemp );
            ABC_FREE( pInits );
        }
    }
    else
    {
        if ( Abc_NtkGetChoiceNum(pAbc->pNtkCur) )
            pAig = Abc_NtkToDarChoices( pAbc->pNtkCur );
        else
            pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        pGia = Gia_ManFromAig( pAig );
        Aig_ManStop( pAig );
    }
    // copy names
    if ( fNames )
    {
        pGia->vNamesIn  = Abc_NtkCollectCiNames( pAbc->pNtkCur );
        pGia->vNamesOut = Abc_NtkCollectCoNames( pAbc->pNtkCur );
    }
    // copy user timing information
    if ( pAbc->pNtkCur->pManTime != NULL )
    {
        Abc_Ntk_t * pNtk = pAbc->pNtkCur;
        Vec_FltFreeP( &pGia->vInArrs );
        Vec_FltFreeP( &pGia->vOutReqs );
        pGia->DefInArrs  = Abc_NtkReadDefaultArrivalWorst(pNtk);
        pGia->DefOutReqs = Abc_NtkReadDefaultRequiredWorst(pNtk);
        pGia->vInArrs  = Vec_FltAllocArray( Abc_NtkGetCiArrivalFloats(pNtk), Abc_NtkCiNum(pNtk) );
        pGia->vOutReqs = Vec_FltAllocArray( Abc_NtkGetCoRequiredFloats(pNtk), Abc_NtkCoNum(pNtk) );
        pGia->And2Delay = pNtk->AndGateDelay;
    }
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &get [-cmnvh] <file>\n" );
    Abc_Print( -2, "\t         converts the current network into GIA and moves it to the &-space\n" );
    Abc_Print( -2, "\t         (if the network is a sequential logic network, normalizes the flops\n" );
    Abc_Print( -2, "\t         to have const-0 initial values, equivalent to \"undc; st; zero\")\n" );
    Abc_Print( -2, "\t-c     : toggles allowing simple GIA to be imported [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles preserving the current mapping [default = %s]\n", fMapped? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggles saving CI/CO names of the AIG [default = %s]\n", fNames? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}